

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  ulong uVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar4;
  size_type sVar5;
  pointer pcVar6;
  EpsCopyOutputStream out;
  LogFinisher local_a9;
  LogMessage local_a8;
  pointer local_70;
  char *local_68;
  undefined8 local_40;
  undefined2 local_38;
  byte local_36;
  ulong value;
  
  sVar2 = output->_M_string_length;
  iVar3 = (*this->_vptr_MessageLite[8])();
  value = CONCAT44(extraout_var,iVar3);
  if ((value & 0xffffffff80000000) == 0) {
    uVar1 = value + sVar2;
    sVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(output->_M_dataplus)._M_p != &output->field_2) {
      sVar5 = (output->field_2)._M_allocated_capacity;
    }
    if (sVar5 < uVar1) {
      std::__cxx11::string::reserve((ulong)output);
    }
    std::__cxx11::string::resize((ulong)output,(char)uVar1);
    pcVar6 = (output->_M_dataplus)._M_p + sVar2;
    local_36 = io::CodedOutputStream::default_serialization_deterministic_ & 1;
    local_68 = (char *)0x0;
    local_40 = 0;
    local_38 = 0;
    local_70 = pcVar6 + value;
    iVar3 = (*this->_vptr_MessageLite[0xb])(this,pcVar6);
    if (pcVar6 + value == (pointer)CONCAT44(extraout_var_00,iVar3)) goto LAB_0031ee07;
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x161);
    pLVar4 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: target + size == res: ");
    internal::LogFinisher::operator=(&local_a9,pLVar4);
    pLVar4 = &local_a8;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1c2);
    (*this->_vptr_MessageLite[2])(&local_a8,this);
    pLVar4 = internal::LogMessage::operator<<((LogMessage *)&local_70,(string *)&local_a8);
    pLVar4 = internal::LogMessage::operator<<(pLVar4," exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=(&local_a9,pLVar4);
    if (local_a8._0_8_ != (long)&local_a8 + 0x10U) {
      operator_delete((void *)local_a8._0_8_);
    }
    pLVar4 = (LogMessage *)&local_70;
  }
  internal::LogMessage::~LogMessage(pLVar4);
LAB_0031ee07:
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(std::string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitializedAmortized(output, old_size + byte_size);
  uint8_t* start =
      reinterpret_cast<uint8_t*>(io::mutable_string_data(output) + old_size);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}